

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnusedSensitiveSignal.cpp
# Opt level: O0

void __thiscall
unused_sensitive_signal::MainVisitor::handle(AlwaysFFVisitor *this,ProceduralBlockSymbol *block)

{
  SourceLocation location;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view arg;
  string_view path;
  bool bVar1;
  byte bVar2;
  Statement *pSVar3;
  TimedStatement *pTVar4;
  iterator iVar5;
  iterator iVar6;
  back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
  bVar7;
  back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
  __a;
  reference ppVar8;
  CheckConfigs *pCVar9;
  pointer in_RSI;
  SourceLocation in_RDI;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> signal;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  *__range2;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  unusedSignals;
  anon_class_1_0_00000001 compare;
  CollectAllIdentifiers timingIdVisitor;
  CollectAllIdentifiers stmtIdVisitor;
  CollectAllIdentifiers *in_stack_fffffffffffffde8;
  Diagnostic *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdfe;
  undefined1 in_stack_fffffffffffffdff;
  CheckConfigs *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  byte in_stack_fffffffffffffe17;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  Diagnostic *this_00;
  undefined1 *puVar10;
  SourceManager *in_stack_fffffffffffffe78;
  allocator<char> local_159 [33];
  __sv_type local_138;
  size_t local_128;
  ProceduralBlockSymbol *in_stack_fffffffffffffee0;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
  local_f8;
  undefined1 *local_f0;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  *local_e8;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
  *local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *local_d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *local_c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *local_b8;
  undefined1 local_b0 [32];
  TidyVisitor *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined1 local_40 [48];
  pointer local_10;
  
  local_10 = in_RSI;
  slang::not_null<const_slang::SourceManager_*>::operator->
            ((not_null<const_slang::SourceManager_*> *)0x397e9c);
  local_40._24_8_ =
       (local_10->ranges).
       super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_40._32_16_ =
       (undefined1  [16])slang::SourceManager::getFileName(in_stack_fffffffffffffe78,in_RDI);
  path._M_str = in_stack_ffffffffffffff80;
  path._M_len = in_stack_ffffffffffffff78;
  bVar1 = TidyVisitor::skip(in_stack_ffffffffffffff70,path);
  if ((!bVar1) &&
     (((*(int *)&(local_10->notes).
                 super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 5 ||
       (*(int *)&(local_10->notes).
                 super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 2)) &&
      (pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(in_stack_fffffffffffffee0),
      pSVar3->kind == Timed)))) {
    pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(in_stack_fffffffffffffee0);
    pTVar4 = slang::ast::Statement::as<slang::ast::TimedStatement>(pSVar3);
    if (pTVar4->stmt->kind == Block) {
      CollectAllIdentifiers::CollectAllIdentifiers((CollectAllIdentifiers *)0x397f5b);
      CollectAllIdentifiers::CollectAllIdentifiers((CollectAllIdentifiers *)0x397f68);
      pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(in_stack_fffffffffffffee0);
      pTVar4 = slang::ast::Statement::as<slang::ast::TimedStatement>(pSVar3);
      slang::ast::Statement::as<slang::ast::BlockStatement>(pTVar4->stmt);
      slang::ast::BlockStatement::
      visitStmts<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers&>
                ((BlockStatement *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      pSVar3 = slang::ast::ProceduralBlockSymbol::getBody(in_stack_fffffffffffffee0);
      slang::ast::Statement::as<slang::ast::TimedStatement>(pSVar3);
      slang::ast::TimingControl::visit<unused_sensitive_signal::MainVisitor::CollectAllIdentifiers>
                ((TimingControl *)in_stack_fffffffffffffe00,
                 (CollectAllIdentifiers *)
                 CONCAT17(in_stack_fffffffffffffdff,
                          CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)));
      iVar5 = std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
              ::begin(&in_stack_fffffffffffffde8->identifiers);
      iVar6 = std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
              ::end(&in_stack_fffffffffffffde8->identifiers);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>
                (iVar5._M_current,iVar6._M_current);
      iVar5 = std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
              ::begin(&in_stack_fffffffffffffde8->identifiers);
      iVar6 = std::
              vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
              ::end(&in_stack_fffffffffffffde8->identifiers);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>
                (iVar5._M_current,iVar6._M_current);
      puVar10 = local_b0;
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
      ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                *)0x3980a5);
      __t = &local_58;
      local_b8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                  *)std::
                    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                    ::begin(&in_stack_fffffffffffffde8->identifiers);
      local_c0 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                  *)std::
                    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                    ::end(&in_stack_fffffffffffffde8->identifiers);
      this_00 = (Diagnostic *)local_40;
      local_c8 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                  *)std::
                    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                    ::begin(&in_stack_fffffffffffffde8->identifiers);
      local_d0 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                  *)std::
                    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                    ::end(&in_stack_fffffffffffffde8->identifiers);
      bVar7 = std::
              back_inserter<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>
                        (&in_stack_fffffffffffffde8->identifiers);
      local_d8 = (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                  *)bVar7;
      __a = std::
            set_difference<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,std::back_insert_iterator<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>>>>,unused_sensitive_signal::MainVisitor::handle(slang::ast::ProceduralBlockSymbol_const&)::_lambda(auto:1_const&,auto:2_const&)_1_>
                      (local_b8,local_c0,local_c8,local_d0,bVar7.container);
      local_f0 = local_b0;
      local_e8 = (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                  *)__a;
      local_f8._M_current =
           (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
           std::
           vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
           ::begin(&in_stack_fffffffffffffde8->identifiers);
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
      ::end(&in_stack_fffffffffffffde8->identifiers);
      while (bVar1 = __gnu_cxx::
                     operator==<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
                               ((__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
                                 *)in_stack_fffffffffffffdf0,
                                (__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
                                 *)in_stack_fffffffffffffde8), ((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
                 ::operator*(&local_f8);
        local_128 = (ppVar8->first)._M_len;
        pCVar9 = TidyConfig::getCheckConfigs(*(TidyConfig **)((long)in_RDI + 0x10));
        local_138 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffdf0);
        __x._M_str = (char *)__a.container;
        __x._M_len = (size_t)pCVar9;
        __y._M_str._0_7_ = in_stack_fffffffffffffe10;
        __y._M_len = (size_t)in_stack_fffffffffffffe08;
        __y._M_str._7_1_ = in_stack_fffffffffffffe17;
        bVar1 = std::operator==(__x,__y);
        in_stack_fffffffffffffe17 = 0;
        bVar2 = in_stack_fffffffffffffe17;
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffffe08 = local_159;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     __t,(allocator<char> *)__a.container);
          in_stack_fffffffffffffe00 =
               TidyConfig::getCheckConfigs(*(TidyConfig **)((long)in_RDI + 0x10));
          in_stack_fffffffffffffdff =
               std::
               regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                         (&in_stack_fffffffffffffe00->clkName,
                          (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                          CONCAT17(in_stack_fffffffffffffdff,
                                   CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)),
                          (match_flag_type)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
          bVar2 = in_stack_fffffffffffffdff ^ 0xff;
          in_stack_fffffffffffffe17 = bVar2;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdf0);
          std::allocator<char>::~allocator(local_159);
        }
        in_stack_fffffffffffffdfe = bVar2;
        if ((in_stack_fffffffffffffdfe & 1) != 0) {
          location._6_1_ = in_stack_fffffffffffffdfe;
          location._0_6_ = in_stack_fffffffffffffdf8;
          location._7_1_ = in_stack_fffffffffffffdff;
          in_stack_fffffffffffffdf0 =
               slang::Diagnostics::add
                         ((Diagnostics *)in_stack_fffffffffffffdf0,
                          SUB84((ulong)in_stack_fffffffffffffe00 >> 0x20,0),location);
          arg._M_str = (char *)bVar7.container;
          arg._M_len = (size_t)puVar10;
          slang::Diagnostic::operator<<(this_00,arg);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>_>
        ::operator++(&local_f8);
      }
      std::
      vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
      ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>_>_>
                 *)in_stack_fffffffffffffe00);
      CollectAllIdentifiers::~CollectAllIdentifiers((CollectAllIdentifiers *)0x39845e);
      CollectAllIdentifiers::~CollectAllIdentifiers((CollectAllIdentifiers *)0x39846b);
    }
  }
  return;
}

Assistant:

void handle(const ProceduralBlockSymbol& block) {
        NEEDS_SKIP_SYMBOL(block)

        if (block.procedureKind != ProceduralBlockKind::AlwaysFF &&
            block.procedureKind != ProceduralBlockKind::Always)
            return;

        if (block.getBody().kind != StatementKind::Timed ||
            block.getBody().as<TimedStatement>().stmt.kind != StatementKind::Block)
            return;

        CollectAllIdentifiers stmtIdVisitor, timingIdVisitor;
        block.getBody().as<TimedStatement>().stmt.as<BlockStatement>().visitStmts(stmtIdVisitor);
        block.getBody().as<TimedStatement>().timing.visit(timingIdVisitor);

        auto compare = [](const auto& a, const auto& b) { return a.first < b.first; };

        std::sort(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(), compare);
        std::sort(stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(), compare);

        std::vector<std::pair<std::string_view, SourceLocation>> unusedSignals;

        std::set_difference(timingIdVisitor.identifiers.begin(), timingIdVisitor.identifiers.end(),
                            stmtIdVisitor.identifiers.begin(), stmtIdVisitor.identifiers.end(),
                            std::back_inserter(unusedSignals), compare);

        for (auto signal : unusedSignals) {
            // either match against clkName or against the regex pattern
            if (signal.first != config.getCheckConfigs().clkName &&
                !(std::regex_match(std::string(signal.first),
                                   config.getCheckConfigs().clkNameRegexPattern)))
                diags.add(diag::UnusedSensitiveSignal, signal.second) << signal.first;
        }
    }